

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O3

string * __thiscall
lambda::parse_from(std::istream&)::helper::get_var_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  string_view s;
  Shared_string local_38;
  
  do {
    parse_from::helper::eat_whitespace((helper *)this);
    iVar3 = std::istream::get();
    if (iVar3 != 0x28) {
LAB_00103258:
      iVar4 = isalpha(iVar3);
      if ((iVar3 != 0x5f) && (iVar4 == 0)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x20);
        s._M_str = "expected a variable";
        s._M_len = 0x13;
        ublib::Shared_string::Shared_string(&local_38,s);
        *puVar5 = &PTR__Parse_error_00109ba8;
        puVar5[1] = local_38.length_;
        uVar1 = local_38.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._0_4_;
        uVar2 = local_38.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._4_4_;
        local_38.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(undefined4 *)(puVar5 + 2) =
             local_38.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr._0_4_;
        *(undefined4 *)((long)puVar5 + 0x14) =
             local_38.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr._4_4_;
        *(undefined4 *)(puVar5 + 3) = uVar1;
        *(undefined4 *)((long)puVar5 + 0x1c) = uVar2;
        local_38.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        __cxa_throw(puVar5,&Parse_error::typeinfo,Parse_error::~Parse_error);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      while( true ) {
        iVar3 = std::istream::peek();
        iVar4 = isalnum(iVar3);
        if (((iVar4 == 0) && (iVar3 != 0x5f)) && (iVar3 != 0x27)) break;
        std::istream::get();
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      return (string *)CONCAT44(extraout_var,iVar4);
    }
    iVar3 = std::istream::peek();
    if (iVar3 != 0x2a) {
      iVar3 = 0x28;
      goto LAB_00103258;
    }
    std::istream::get();
    parse_from::helper::comment((helper *)this);
  } while( true );
}

Assistant:

std::string get_var() {
      eat_whitespace();
      auto ch = inp.get();

      if (ch == '(' and inp.peek() == '*') {
        inp.get();
        comment();
        return get_var();
      }

      if (not(std::isalpha(ch) or ch == '_')) {
        throw Parse_error("expected a variable");
      }

      std::string buffer;
      buffer.push_back(static_cast<char>(ch));
      for (;;) {
        ch = inp.peek();
        if (std::isalnum(ch) or ch == '_' or ch == '\'') {
          inp.get();
          buffer.push_back(static_cast<char>(ch));
        } else {
          break;
        }
      }
      return buffer;
    }